

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

void ncnn::binary_op_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  float local_5c;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  iVar4 = b->elempack;
  iVar9 = b->h * b->w * b->d;
  uVar2 = b->c;
  if (uVar2 * iVar4 * iVar9 == 1) {
    local_5c = *b->data;
    iVar4 = a->h;
    iVar9 = a->w;
    iVar6 = a->d;
    iVar5 = a->elempack;
    uVar15 = 0;
    uVar10 = (ulong)(uint)a->c;
    if (a->c < 1) {
      uVar10 = uVar15;
    }
    for (; uVar10 != uVar15; uVar15 = uVar15 + 1) {
      binary_op_vector((float *)(a->cstep * uVar15 * a->elemsize + (long)a->data),&local_5c,
                       (float *)(c->cstep * uVar15 * c->elemsize + (long)c->data),
                       iVar4 * iVar9 * iVar6 * iVar5,1,1,1,op_type);
    }
  }
  else {
    auVar3._0_4_ = b->dims;
    auVar3._4_4_ = b->w;
    auVar3._8_4_ = b->h;
    auVar3._12_4_ = b->d;
    auVar3 = vpinsrd_avx(auVar3,b->w,1);
    auVar3 = vpinsrd_avx(auVar3,b->h,2);
    auVar3 = vpinsrd_avx(auVar3,b->d,3);
    auVar1._0_4_ = a->dims;
    auVar1._4_4_ = a->w;
    auVar1._8_4_ = a->h;
    auVar1._12_4_ = a->d;
    if (((auVar3 == auVar1) && (a->c == uVar2)) && (a->elempack == iVar4)) {
      iVar9 = iVar9 * iVar4;
      uVar15 = 0;
      uVar10 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar10 = uVar15;
      }
      for (; uVar10 != uVar15; uVar15 = uVar15 + 1) {
        binary_op_vector((float *)(a->cstep * uVar15 * a->elemsize + (long)a->data),
                         (float *)(b->cstep * uVar15 * b->elemsize + (long)b->data),
                         (float *)(c->cstep * uVar15 * c->elemsize + (long)c->data),iVar9,iVar9,1,1,
                         op_type);
      }
    }
    else {
      iVar4 = c->dims;
      if (iVar4 == 2) {
        uVar10 = 0;
        uVar15 = (ulong)(uint)c->h;
        if (c->h < 1) {
          uVar15 = 0;
        }
        for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
          iVar9 = a->h + -1;
          iVar6 = (int)uVar10;
          if (iVar6 <= iVar9) {
            iVar9 = iVar6;
          }
          iVar5 = b->h + -1;
          if (iVar6 <= iVar5) {
            iVar5 = iVar6;
          }
          binary_op_vector((float *)((long)iVar9 * (long)a->w * a->elemsize + (long)a->data),
                           (float *)((long)iVar5 * (long)b->w * b->elemsize + (long)b->data),
                           (float *)((long)c->w * uVar10 * c->elemsize + (long)c->data),a->w,b->w,
                           a->elempack,b->elempack,op_type);
        }
      }
      if (iVar4 - 3U < 2) {
        uVar10 = 0;
        local_48 = (ulong)(uint)c->c;
        if (c->c < 1) {
          local_48 = uVar10;
        }
        for (; uVar10 != local_48; uVar10 = uVar10 + 1) {
          iVar4 = a->c + -1;
          iVar9 = (int)uVar10;
          if (iVar9 <= iVar4) {
            iVar4 = iVar9;
          }
          iVar6 = b->c + -1;
          if (iVar9 <= iVar6) {
            iVar6 = iVar9;
          }
          iVar9 = b->w * b->h;
          lVar11 = (long)iVar4;
          lVar14 = (long)iVar6;
          if (b->d * iVar9 == 1) {
            binary_op_vector((float *)(lVar11 * a->cstep * a->elemsize + (long)a->data),
                             (float *)(lVar14 * b->cstep * b->elemsize + (long)b->data),
                             (float *)(c->cstep * uVar10 * c->elemsize + (long)c->data),
                             a->h * a->w * a->d,1,a->elempack,b->elempack,op_type);
          }
          else {
            local_50 = lVar14;
            if (iVar9 == 1) {
              for (lVar14 = 0; lVar14 < c->d; lVar14 = lVar14 + 1) {
                iVar4 = a->d + -1;
                iVar9 = (int)lVar14;
                if (iVar9 <= iVar4) {
                  iVar4 = iVar9;
                }
                iVar6 = b->d + -1;
                if (iVar9 <= iVar6) {
                  iVar6 = iVar9;
                }
                binary_op_vector((float *)((long)a->data +
                                          (long)a->w * (long)a->h * a->elemsize * (long)iVar4 +
                                          a->cstep * lVar11 * a->elemsize),
                                 (float *)((long)b->data +
                                          (long)b->h * (long)b->w * b->elemsize * (long)iVar6 +
                                          b->cstep * local_50 * b->elemsize),
                                 (float *)((long)c->data +
                                          (long)c->h * c->elemsize * c->w * lVar14 +
                                          c->cstep * uVar10 * c->elemsize),a->h * a->w,1,a->elempack
                                 ,b->elempack,op_type);
              }
            }
            else {
              local_58 = uVar10;
              local_40 = lVar11;
              for (lVar8 = 0; uVar10 = local_58, lVar8 < c->d; lVar8 = lVar8 + 1) {
                iVar4 = a->d + -1;
                iVar9 = (int)lVar8;
                if (iVar9 <= iVar4) {
                  iVar4 = iVar9;
                }
                iVar6 = b->d + -1;
                if (iVar9 <= iVar6) {
                  iVar6 = iVar9;
                }
                local_38 = (long)iVar4;
                for (lVar11 = 0; lVar11 < c->h; lVar11 = lVar11 + 1) {
                  iVar4 = a->h + -1;
                  iVar9 = (int)lVar11;
                  if (iVar9 <= iVar4) {
                    iVar4 = iVar9;
                  }
                  iVar5 = b->h + -1;
                  if (iVar9 <= iVar5) {
                    iVar5 = iVar9;
                  }
                  lVar12 = a->elemsize * (long)a->w;
                  lVar13 = b->elemsize * (long)b->w;
                  lVar7 = (long)c->w * c->elemsize;
                  binary_op_vector((float *)((long)a->data +
                                            iVar4 * lVar12 + a->h * local_38 * lVar12 +
                                            a->cstep * local_40 * a->elemsize),
                                   (float *)((long)b->data +
                                            iVar5 * lVar13 + (long)b->h * (long)iVar6 * lVar13 +
                                            b->cstep * lVar14 * b->elemsize),
                                   (float *)((long)c->data +
                                            lVar7 * lVar11 + c->h * lVar8 * lVar7 +
                                            c->cstep * local_58 * c->elemsize),a->w,b->w,a->elempack
                                   ,b->elempack,op_type);
                  lVar14 = local_50;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    if (b.w * b.h * b.d * b.c * b.elempack == 1)
    {
        return binary_op_scalar(a, b[0], c, op_type, opt);
    }

    if (a.dims == b.dims && a.w == b.w && a.h == b.h && a.d == b.d && a.c == b.c && a.elempack == b.elempack)
    {
        return binary_op_no_broadcast(a, b, c, op_type, opt);
    }

    const int dims = c.dims;

    if (dims == 2)
    {
        const int h = c.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const int y0 = std::min(y, a.h - 1);
            const int y1 = std::min(y, b.h - 1);

            const float* ptr = a.row(y0);
            const float* ptr1 = b.row(y1);
            float* outptr = c.row(y);

            binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int channels = c.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int q0 = std::min(q, a.c - 1);
            const int q1 = std::min(q, b.c - 1);

            if (b.d * b.h * b.w == 1)
            {
                const float* ptr = a.channel(q0);
                const float* ptr1 = b.channel(q1);
                float* outptr = c.channel(q);

                binary_op_vector(ptr, ptr1, outptr, a.w * a.h * a.d, 1, a.elempack, b.elempack, op_type);
                continue;
            }

            if (b.h * b.w == 1)
            {
                for (int z = 0; z < c.d; z++)
                {
                    const int z0 = std::min(z, a.d - 1);
                    const int z1 = std::min(z, b.d - 1);

                    const float* ptr = a.channel(q0).depth(z0);
                    const float* ptr1 = b.channel(q1).depth(z1);
                    float* outptr = c.channel(q).depth(z);

                    binary_op_vector(ptr, ptr1, outptr, a.w * a.h, 1, a.elempack, b.elempack, op_type);
                }
                continue;
            }

            for (int z = 0; z < c.d; z++)
            {
                const int z0 = std::min(z, a.d - 1);
                const int z1 = std::min(z, b.d - 1);

                for (int y = 0; y < c.h; y++)
                {
                    const int y0 = std::min(y, a.h - 1);
                    const int y1 = std::min(y, b.h - 1);

                    const float* ptr = a.channel(q0).depth(z0).row(y0);
                    const float* ptr1 = b.channel(q1).depth(z1).row(y1);
                    float* outptr = c.channel(q).depth(z).row(y);

                    binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
                }
            }
        }
    }
}